

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::NegativeSamplingLoss::NegativeSamplingLoss
          (NegativeSamplingLoss *this,shared_ptr<fasttext::Matrix> *wo,int neg,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  undefined1 auVar1 [16];
  vector<int,_std::allocator<int>_> *pvVar2;
  const_reference pvVar3;
  value_type_conflict1 *pvVar4;
  vector<long,_std::allocator<long>_> *in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  size_t j;
  real c;
  size_t i_1;
  size_t i;
  real z;
  shared_ptr<fasttext::Matrix> *in_stack_ffffffffffffff78;
  value_type_conflict1 *__x;
  BinaryLogisticLoss *in_stack_ffffffffffffff80;
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 local_68;
  undefined8 local_60;
  long local_50;
  value_type_conflict1 *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  float local_30;
  undefined1 extraout_var [56];
  
  BinaryLogisticLoss::BinaryLogisticLoss(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *in_RDI = &PTR__NegativeSamplingLoss_001cba78;
  *(undefined4 *)(in_RDI + 8) = in_EDX;
  *(undefined1 (*) [16])(in_RDI + 9) = (undefined1  [16])0x0;
  in_RDI[0xb] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19ec40);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)0x19ec4e);
  local_30 = 0.0;
  local_38 = (vector<int,_std::allocator<int>_> *)0x0;
  while( true ) {
    this_00 = local_38;
    pvVar2 = (vector<int,_std::allocator<int>_> *)
             std::vector<long,_std::allocator<long>_>::size(in_RCX);
    if (pvVar2 <= this_00) break;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RCX,(size_type)local_38);
    dVar6 = pow((double)*pvVar3,0.5);
    local_30 = (float)((double)local_30 + dVar6);
    local_38 = (vector<int,_std::allocator<int>_> *)
               ((long)&(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  local_40 = (value_type_conflict1 *)0x0;
  while( true ) {
    __x = local_40;
    pvVar4 = (value_type_conflict1 *)std::vector<long,_std::allocator<long>_>::size(in_RCX);
    if (pvVar4 <= __x) break;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RCX,(size_type)local_40);
    auVar7._0_8_ = pow((double)*pvVar3,0.5);
    auVar7._8_56_ = extraout_var;
    auVar8 = ZEXT1664(CONCAT124(auVar7._4_12_,(float)auVar7._0_8_));
    local_50 = 0;
    while( true ) {
      auVar1 = vcvtusi2ss_avx512f(auVar8._0_16_,local_50);
      fVar5 = ((float)auVar7._0_8_ * 1e+07) / local_30;
      auVar8 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar5));
      if (fVar5 <= auVar1._0_4_) break;
      std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
      local_50 = local_50 + 1;
    }
    local_40 = (value_type_conflict1 *)((long)local_40 + 1);
  }
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 9));
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)this_00,(unsigned_long)__x,0x19ede4);
  in_RDI[0xc] = local_68;
  in_RDI[0xd] = local_60;
  return;
}

Assistant:

NegativeSamplingLoss::NegativeSamplingLoss(
    std::shared_ptr<Matrix>& wo,
    int neg,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo), neg_(neg), negatives_(), uniform_() {
  real z = 0.0;
  for (size_t i = 0; i < targetCounts.size(); i++) {
    z += pow(targetCounts[i], 0.5);
  }
  for (size_t i = 0; i < targetCounts.size(); i++) {
    real c = pow(targetCounts[i], 0.5);
    for (size_t j = 0; j < c * NegativeSamplingLoss::NEGATIVE_TABLE_SIZE / z;
         j++) {
      negatives_.push_back(i);
    }
  }
  uniform_ = std::uniform_int_distribution<size_t>(0, negatives_.size() - 1);
}